

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::SourceCodeInfo_Location::MergeFrom
          (SourceCodeInfo_Location *this,SourceCodeInfo_Location *from)

{
  uint uVar1;
  void *pvVar2;
  string *psVar3;
  string *psVar4;
  LogMessage *other;
  Arena *pAVar5;
  LogMessage local_60;
  LogFinisher local_21;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/descriptor.pb.cc"
               ,0x28a0);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  pvVar2 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,
               (UnknownFieldSet *)(((ulong)pvVar2 & 0xfffffffffffffffe) + 8));
  }
  RepeatedField<int>::MergeFrom(&this->path_,&from->path_);
  RepeatedField<int>::MergeFrom(&this->span_,&from->span_);
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->leading_detached_comments_).super_RepeatedPtrFieldBase,
             &(from->leading_detached_comments_).super_RepeatedPtrFieldBase);
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar3 = (from->leading_comments_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
      pAVar5 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      psVar4 = (this->leading_comments_).ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->leading_comments_,pAVar5,psVar3);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
    }
    if ((uVar1 & 2) != 0) {
      psVar3 = (from->trailing_comments_).ptr_;
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 2;
      pAVar5 = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar5 & 1) != 0) {
        pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
      }
      psVar4 = (this->trailing_comments_).ptr_;
      if (psVar4 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance(&this->trailing_comments_,pAVar5,psVar3);
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar4);
      }
    }
  }
  return;
}

Assistant:

void SourceCodeInfo_Location::MergeFrom(const SourceCodeInfo_Location& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.SourceCodeInfo.Location)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  path_.MergeFrom(from.path_);
  span_.MergeFrom(from.span_);
  leading_detached_comments_.MergeFrom(from.leading_detached_comments_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_leading_comments(from._internal_leading_comments());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_trailing_comments(from._internal_trailing_comments());
    }
  }
}